

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum_core.cpp
# Opt level: O3

mbedtls_mpi_uint
mbedtls_mpi_core_mla
          (mbedtls_mpi_uint *d,size_t d_len,mbedtls_mpi_uint *s,size_t s_len,mbedtls_mpi_uint b)

{
  ulong *puVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  mbedtls_mpi_uint mVar25;
  ulong uVar26;
  
  if (d_len < s_len) {
    s_len = d_len;
  }
  if (s_len < 8) {
    mVar25 = 0;
  }
  else {
    uVar23 = s_len >> 3;
    mVar25 = 0;
    do {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = b;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *s;
      uVar21 = SUB168(auVar3 * auVar12,0);
      uVar22 = uVar21 + mVar25;
      uVar2 = *d;
      *d = *d + uVar22;
      uVar26 = (ulong)CARRY8(uVar21,mVar25) + SUB168(auVar3 * auVar12,8) +
               (ulong)CARRY8(uVar2,uVar22);
      auVar4._8_8_ = 0;
      auVar4._0_8_ = b;
      auVar13._8_8_ = 0;
      auVar13._0_8_ = s[1];
      uVar21 = SUB168(auVar4 * auVar13,0);
      uVar22 = uVar21 + uVar26;
      puVar1 = d + 1;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar22;
      uVar26 = (ulong)CARRY8(uVar21,uVar26) + SUB168(auVar4 * auVar13,8) +
               (ulong)CARRY8(uVar2,uVar22);
      auVar5._8_8_ = 0;
      auVar5._0_8_ = b;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = s[2];
      uVar21 = SUB168(auVar5 * auVar14,0);
      uVar22 = uVar21 + uVar26;
      puVar1 = d + 2;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar22;
      uVar26 = (ulong)CARRY8(uVar21,uVar26) + SUB168(auVar5 * auVar14,8) +
               (ulong)CARRY8(uVar2,uVar22);
      auVar6._8_8_ = 0;
      auVar6._0_8_ = b;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = s[3];
      uVar21 = SUB168(auVar6 * auVar15,0);
      uVar22 = uVar21 + uVar26;
      puVar1 = d + 3;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar22;
      uVar26 = (ulong)CARRY8(uVar21,uVar26) + SUB168(auVar6 * auVar15,8) +
               (ulong)CARRY8(uVar2,uVar22);
      auVar7._8_8_ = 0;
      auVar7._0_8_ = b;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = s[4];
      uVar21 = SUB168(auVar7 * auVar16,0);
      uVar22 = uVar21 + uVar26;
      puVar1 = d + 4;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar22;
      uVar26 = (ulong)CARRY8(uVar21,uVar26) + SUB168(auVar7 * auVar16,8) +
               (ulong)CARRY8(uVar2,uVar22);
      auVar8._8_8_ = 0;
      auVar8._0_8_ = b;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = s[5];
      uVar21 = SUB168(auVar8 * auVar17,0);
      uVar22 = uVar21 + uVar26;
      puVar1 = d + 5;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar22;
      uVar26 = (ulong)CARRY8(uVar21,uVar26) + SUB168(auVar8 * auVar17,8) +
               (ulong)CARRY8(uVar2,uVar22);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = b;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = s[6];
      uVar21 = SUB168(auVar9 * auVar18,0);
      uVar22 = uVar21 + uVar26;
      puVar1 = d + 6;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar22;
      uVar26 = (ulong)CARRY8(uVar21,uVar26) + SUB168(auVar9 * auVar18,8) +
               (ulong)CARRY8(uVar2,uVar22);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = b;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = s[7];
      uVar21 = SUB168(auVar10 * auVar19,0);
      s = s + 8;
      uVar22 = uVar21 + uVar26;
      puVar1 = d + 7;
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar22;
      mVar25 = (ulong)CARRY8(uVar21,uVar26) + SUB168(auVar10 * auVar19,8) +
               (ulong)CARRY8(uVar2,uVar22);
      d = d + 8;
      uVar23 = uVar23 - 1;
    } while (uVar23 != 0);
  }
  if ((s_len & 7) != 0) {
    uVar23 = 0;
    do {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = b;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)((long)s + uVar23);
      uVar21 = SUB168(auVar11 * auVar20,0);
      uVar22 = uVar21 + mVar25;
      puVar1 = (ulong *)((long)d + uVar23);
      uVar2 = *puVar1;
      *puVar1 = *puVar1 + uVar22;
      mVar25 = (ulong)CARRY8(uVar21,mVar25) + SUB168(auVar11 * auVar20,8) +
               (ulong)CARRY8(uVar2,uVar22);
      uVar23 = uVar23 + 8;
    } while (((uint)s_len & 7) << 3 != uVar23);
    d = (mbedtls_mpi_uint *)((long)d + uVar23);
  }
  if (d_len != s_len) {
    lVar24 = 0;
    do {
      puVar1 = d + lVar24;
      uVar23 = *puVar1;
      *puVar1 = *puVar1 + mVar25;
      mVar25 = (mbedtls_mpi_uint)CARRY8(uVar23,mVar25);
      lVar24 = lVar24 + 1;
    } while (d_len - s_len != lVar24);
  }
  return mVar25;
}

Assistant:

mbedtls_mpi_uint mbedtls_mpi_core_mla(mbedtls_mpi_uint *d, size_t d_len,
                                      const mbedtls_mpi_uint *s, size_t s_len,
                                      mbedtls_mpi_uint b)
{
    mbedtls_mpi_uint c = 0; /* carry */
    /*
     * It is a documented precondition of this function that d_len >= s_len.
     * If that's not the case, we swap these round: this turns what would be
     * a buffer overflow into an incorrect result.
     */
    if (d_len < s_len) {
        s_len = d_len;
    }
    size_t excess_len = d_len - s_len;
    size_t steps_x8 = s_len / 8;
    size_t steps_x1 = s_len & 7;

    while (steps_x8--) {
        MULADDC_X8_INIT
        MULADDC_X8_CORE
            MULADDC_X8_STOP
    }

    while (steps_x1--) {
        MULADDC_X1_INIT
        MULADDC_X1_CORE
            MULADDC_X1_STOP
    }

    while (excess_len--) {
        *d += c;
        c = (*d < c);
        d++;
    }

    return c;
}